

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  pointer *this_00;
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  char *mtl_basedir;
  size_type sVar15;
  undefined8 uVar16;
  material_t *pmVar17;
  long lVar18;
  ostream *poVar19;
  reference pvVar20;
  reference pvVar21;
  reference pvVar22;
  reference pvVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  result_type_conflict rVar28;
  result_type_conflict rVar29;
  float nz;
  float ny;
  float nx;
  float pz;
  float py;
  float px;
  uchar b;
  uchar g;
  uchar r;
  int y;
  int x;
  float coordy;
  float coordx;
  float lambda_b;
  float lambda_a;
  int j;
  int nsamples;
  float s_1;
  float l2;
  float l1;
  float l0;
  float area;
  int k;
  float n [3] [3];
  float ni [3];
  float v [3] [3];
  int vi [3];
  float tc [3] [2];
  int current_material_id;
  index_t idx2;
  index_t idx1;
  index_t idx0;
  size_t f;
  undefined1 local_978 [4];
  int s;
  undefined1 local_958 [8];
  string texture_filename;
  material_t *mp;
  size_t m;
  size_t i;
  int local_918;
  int comp;
  int h;
  int w;
  uchar *image;
  undefined1 local_1b9;
  undefined1 local_1b8 [7];
  bool ret;
  string base_dir;
  undefined1 local_190 [8];
  string filename;
  string err;
  string warn;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  attrib_t attrib;
  uniform_real_distribution<double> distribution;
  default_random_engine generator;
  allocator local_41;
  string local_40;
  int local_1c;
  char **ppcStack_18;
  int point_per_sqm;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_1c = 10000;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    printf("./pc_sampler mesh.obj <optional: points per square meter> > pc.xyz");
    argv_local._4_4_ = 1;
  }
  else {
    if (2 < argc) {
      pcVar14 = argv[2];
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,pcVar14,&local_41);
      local_1c = std::__cxx11::stoi(&local_40,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    printf("# pc sampler\n");
    std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
    linear_congruential_engine
              ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               &distribution._M_param._M_b);
    std::uniform_real_distribution<double>::uniform_real_distribution
              ((uniform_real_distribution<double> *)
               &attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0.0,1.0);
    tinyobj::attrib_t::attrib_t
              ((attrib_t *)
               &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::vector
              ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
               &materials.
                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::vector
              ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
               ((long)&warn.field_2 + 8));
    std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(filename.field_2._M_local_buf + 8));
    pcVar14 = ppcStack_18[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_190,pcVar14,(allocator *)(base_dir.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(base_dir.field_2._M_local_buf + 0xf));
    GetBaseDir((string *)local_1b8,(string *)local_190);
    uVar13 = std::__cxx11::string::empty();
    if ((uVar13 & 1) != 0) {
      std::__cxx11::string::operator=((string *)local_1b8,".");
    }
    std::__cxx11::string::operator+=((string *)local_1b8,"/");
    pcVar14 = (char *)std::__cxx11::string::c_str();
    mtl_basedir = (char *)std::__cxx11::string::c_str();
    local_1b9 = tinyobj::LoadObj((attrib_t *)
                                 &shapes.
                                  super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                                 &materials.
                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                  *)((long)&warn.field_2 + 8),(string *)((long)&err.field_2 + 8),
                                 (string *)((long)&filename.field_2 + 8),pcVar14,mtl_basedir,true,
                                 true);
    sVar15 = std::vector<float,_std::allocator<float>_>::size
                       ((vector<float,_std::allocator<float>_> *)
                        &shapes.
                         super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    printf("# of vertices  = %d\n",(ulong)(uint)((int)sVar15 / 3));
    sVar15 = std::vector<float,_std::allocator<float>_>::size
                       ((vector<float,_std::allocator<float>_> *)
                        &attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    printf("# of normals   = %d\n",(ulong)(uint)((int)sVar15 / 3));
    sVar15 = std::vector<float,_std::allocator<float>_>::size
                       ((vector<float,_std::allocator<float>_> *)
                        &attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    printf("# of texcoords = %d\n",
           (ulong)(uint)((int)sVar15 + (int)((sVar15 & 0xffffffff) >> 0x1f) >> 1));
    sVar15 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size
                       ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                        ((long)&warn.field_2 + 8));
    printf("# of materials = %d\n",sVar15 & 0xffffffff);
    std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::size
              ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
               &materials.
                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    printf("# of shapes    = %d\n");
    memset((anon_struct_1864_47_e17b0a7f *)&image,0,0x748);
    tinyobj::anon_struct_1864_47_e17b0a7f::material_t((anon_struct_1864_47_e17b0a7f *)&image);
    std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
              ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
               ((long)&warn.field_2 + 8),(anon_struct_1864_47_e17b0a7f *)&image);
    tinyobj::anon_struct_1864_47_e17b0a7f::~material_t((anon_struct_1864_47_e17b0a7f *)&image);
    for (m = 0; sVar15 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::
                         size((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                              ((long)&warn.field_2 + 8)), m < sVar15; m = m + 1) {
      std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::operator[]
                ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                 ((long)&warn.field_2 + 8),m);
      uVar16 = std::__cxx11::string::c_str();
      printf("# material[%d].diffuse_texname = %s\n",m & 0xffffffff,uVar16);
    }
    for (mp = (material_t *)0x0;
        pmVar17 = (material_t *)
                  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size
                            ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                             ((long)&warn.field_2 + 8)), mp < pmVar17;
        mp = (material_t *)&(mp->name).field_0x1) {
      texture_filename.field_2._8_8_ =
           std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::operator[]
                     ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                      ((long)&warn.field_2 + 8),(size_type)mp);
      lVar18 = std::__cxx11::string::length();
      if (lVar18 != 0) {
        std::__cxx11::string::string
                  ((string *)local_958,(string *)(texture_filename.field_2._8_8_ + 0x90));
        bVar9 = FileExists((string *)local_958);
        if (!bVar9) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_978,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (texture_filename.field_2._8_8_ + 0x90));
          std::__cxx11::string::operator=((string *)local_958,(string *)local_978);
          std::__cxx11::string::~string((string *)local_978);
          bVar9 = FileExists((string *)local_958);
          if (!bVar9) {
            poVar19 = std::operator<<((ostream *)&std::cerr,"# Unable to find file: ");
            poVar19 = std::operator<<(poVar19,(string *)(texture_filename.field_2._8_8_ + 0x90));
            std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
            exit(1);
          }
        }
        pcVar14 = (char *)std::__cxx11::string::c_str();
        _h = stbi_load(pcVar14,&comp,&local_918,(int *)((long)&i + 4),0);
        if (_h == (stbi_uc *)0x0) {
          poVar19 = std::operator<<((ostream *)&std::cerr,"# Unable to load texture: ");
          poVar19 = std::operator<<(poVar19,(string *)local_958);
          std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
        poVar19 = std::operator<<((ostream *)&std::cout,"# Loaded texture: ");
        poVar19 = std::operator<<(poVar19,(string *)local_958);
        poVar19 = std::operator<<(poVar19,", w = ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,comp);
        poVar19 = std::operator<<(poVar19,", h = ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,local_918);
        poVar19 = std::operator<<(poVar19,", comp = ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,i._4_4_);
        std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_958);
      }
    }
    idx0.normal_index = 0;
    idx0.texcoord_index = 0;
    while( true ) {
      pvVar20 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                          ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                           &materials.
                            super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      sVar15 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::size
                         (&(pvVar20->mesh).indices);
      if (sVar15 / 3 <= (ulong)idx0._4_8_) break;
      pvVar20 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                          ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                           &materials.
                            super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      pvVar21 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::operator[]
                          (&(pvVar20->mesh).indices,idx0._4_8_ * 3);
      uVar3 = pvVar21->vertex_index;
      uVar6 = pvVar21->normal_index;
      iVar11 = pvVar21->texcoord_index;
      pvVar20 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                          ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                           &materials.
                            super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      pvVar21 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::operator[]
                          (&(pvVar20->mesh).indices,idx0._4_8_ * 3 + 1);
      uVar4 = pvVar21->vertex_index;
      uVar7 = pvVar21->normal_index;
      iVar12 = pvVar21->texcoord_index;
      pvVar20 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                          ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                           &materials.
                            super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      pvVar21 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::operator[]
                          (&(pvVar20->mesh).indices,idx0._4_8_ * 3 + 2);
      uVar5 = pvVar21->vertex_index;
      uVar8 = pvVar21->normal_index;
      iVar1 = pvVar21->texcoord_index;
      pvVar20 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                          ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                           &materials.
                            super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      pvVar22 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&(pvVar20->mesh).material_ids,idx0._4_8_);
      iVar2 = *pvVar22;
      if ((iVar2 < 0) ||
         (sVar15 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size
                             ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                              ((long)&warn.field_2 + 8)), (int)sVar15 <= iVar2)) {
        std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size
                  ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                   ((long)&warn.field_2 + 8));
      }
      sVar15 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)
                          &attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      if (sVar15 == 0) {
        vi[1] = 0;
        vi[2] = 0;
        tc[0][0] = 0.0;
        tc[0][1] = 0.0;
        tc[1][0] = 0.0;
        tc[1][1] = 0.0;
      }
      else if (((iVar11 < 0) || (iVar12 < 0)) || (iVar1 < 0)) {
        vi[1] = 0;
        vi[2] = 0;
        tc[0][0] = 0.0;
        tc[0][1] = 0.0;
        tc[1][0] = 0.0;
        tc[1][1] = 0.0;
      }
      else {
        sVar15 = std::vector<float,_std::allocator<float>_>::size
                           ((vector<float,_std::allocator<float>_> *)
                            &attrib.normals.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar15 <= (ulong)(long)(iVar11 * 2 + 1)) {
          __assert_fail("attrib.texcoords.size() > size_t(2 * idx0.texcoord_index + 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                        ,0x94,"int main(int, char **)");
        }
        sVar15 = std::vector<float,_std::allocator<float>_>::size
                           ((vector<float,_std::allocator<float>_> *)
                            &attrib.normals.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar15 <= (ulong)(long)(iVar12 * 2 + 1)) {
          __assert_fail("attrib.texcoords.size() > size_t(2 * idx1.texcoord_index + 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                        ,0x96,"int main(int, char **)");
        }
        sVar15 = std::vector<float,_std::allocator<float>_>::size
                           ((vector<float,_std::allocator<float>_> *)
                            &attrib.normals.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar15 <= (ulong)(long)(iVar1 * 2 + 1)) {
          __assert_fail("attrib.texcoords.size() > size_t(2 * idx2.texcoord_index + 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                        ,0x98,"int main(int, char **)");
        }
        pvVar23 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &attrib.normals.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(iVar11 << 1))
        ;
        vi[1] = (int)*pvVar23;
        pvVar23 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &attrib.normals.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)(iVar11 * 2 + 1));
        vi[2] = (int)(1.0 - *pvVar23);
        pvVar23 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &attrib.normals.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(iVar12 << 1))
        ;
        tc[0][0] = *pvVar23;
        pvVar23 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &attrib.normals.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)(iVar12 * 2 + 1));
        tc[0][1] = 1.0 - *pvVar23;
        pvVar23 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &attrib.normals.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(iVar1 << 1));
        tc[1][0] = *pvVar23;
        pvVar23 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &attrib.normals.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)(iVar1 * 2 + 1));
        tc[1][1] = 1.0 - *pvVar23;
      }
      for (l0 = 0.0; (int)l0 < 3; l0 = (float)((int)l0 + 1)) {
        n[2][1] = (float)(int)uVar6;
        n[2][2] = (float)(int)uVar7;
        ni[0] = (float)(int)uVar8;
        if ((int)uVar3 < 0) {
          __assert_fail("vi[0] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                        ,0xbc,"int main(int, char **)");
        }
        if ((int)uVar4 < 0) {
          __assert_fail("vi[1] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                        ,0xbd,"int main(int, char **)");
        }
        if ((int)uVar5 < 0) {
          __assert_fail("vi[2] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                        ,0xbe,"int main(int, char **)");
        }
        this = &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar23 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)this,
                             (long)(uVar3 * 3 + (int)l0));
        ni[(long)(int)l0 + 1] = *pvVar23;
        pvVar23 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)this,
                             (long)(uVar4 * 3 + (int)l0));
        vi[(long)(int)l0 + -8] = (int)*pvVar23;
        pvVar23 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)this,
                             (long)(uVar5 * 3 + (int)l0));
        vi[(long)(int)l0 + -5] = (int)*pvVar23;
        this_00 = &attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        fVar24 = n[2][1] * 3.0 + (float)(int)l0;
        uVar13 = (ulong)fVar24;
        pvVar23 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)this_00,
                             uVar13 | (long)(fVar24 - 9.223372e+18) & (long)uVar13 >> 0x3f);
        (&area)[(int)l0] = *pvVar23;
        fVar24 = n[2][2] * 3.0 + (float)(int)l0;
        uVar13 = (ulong)fVar24;
        pvVar23 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)this_00,
                             uVar13 | (long)(fVar24 - 9.223372e+18) & (long)uVar13 >> 0x3f);
        ni[(long)(int)l0 + -8] = *pvVar23;
        fVar24 = ni[0] * 3.0 + (float)(int)l0;
        uVar13 = (ulong)fVar24;
        pvVar23 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)this_00,
                             uVar13 | (long)(fVar24 - 9.223372e+18) & (long)uVar13 >> 0x3f);
        ni[(long)(int)l0 + -5] = *pvVar23;
      }
      dVar25 = std::sqrt((double)(ulong)(uint)((v[0][0] - v[1][0]) * (v[0][0] - v[1][0]) +
                                              (ni[1] - v[0][1]) * (ni[1] - v[0][1]) +
                                              (ni[2] - v[0][2]) * (ni[2] - v[0][2])));
      dVar26 = std::sqrt((double)(ulong)(uint)((v[2][0] - v[1][0]) * (v[2][0] - v[1][0]) +
                                              (v[1][1] - v[0][1]) * (v[1][1] - v[0][1]) +
                                              (v[1][2] - v[0][2]) * (v[1][2] - v[0][2])));
      dVar27 = std::sqrt((double)(ulong)(uint)((v[0][0] - v[2][0]) * (v[0][0] - v[2][0]) +
                                              (ni[1] - v[1][1]) * (ni[1] - v[1][1]) +
                                              (ni[2] - v[1][2]) * (ni[2] - v[1][2])));
      fVar24 = (SUB84(dVar25,0) + SUB84(dVar26,0) + SUB84(dVar27,0)) * 0.5;
      dVar25 = std::sqrt((double)(ulong)(uint)(fVar24 * (fVar24 - SUB84(dVar25,0)) *
                                               (fVar24 - SUB84(dVar26,0)) *
                                              (fVar24 - SUB84(dVar27,0))));
      uVar10 = (uint)(SUB84(dVar25,0) * (float)local_1c);
      printf("# area %f nsamples %d \n",(double)SUB84(dVar25,0),(ulong)uVar10);
      for (lambda_b = 0.0; (int)lambda_b < (int)uVar10; lambda_b = (float)((int)lambda_b + 1)) {
        coordy = 1.0;
        coordx = 1.0;
        while (1.0 < coordx + coordy) {
          rVar28 = std::uniform_real_distribution<double>::operator()
                             ((uniform_real_distribution<double> *)
                              &attrib.colors.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                               *)&distribution._M_param._M_b);
          rVar29 = std::uniform_real_distribution<double>::operator()
                             ((uniform_real_distribution<double> *)
                              &attrib.colors.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                               *)&distribution._M_param._M_b);
          coordy = (float)rVar29;
          coordx = (float)rVar28;
        }
        x = (int)(coordy * (tc[1][0] - (float)vi[1]) +
                 coordx * (tc[0][0] - (float)vi[1]) + (float)vi[1]);
        y = (int)(coordy * (tc[1][1] - (float)vi[2]) +
                 coordx * (tc[0][1] - (float)vi[2]) + (float)vi[2]);
        if ((float)x < 0.0) {
          x = 0;
        }
        if (1.0 < (float)x) {
          x = 0x3f800000;
        }
        if ((float)y < 0.0) {
          y = 0;
        }
        if (1.0 < (float)y) {
          y = 0x3f800000;
        }
        iVar11 = (int)((float)x * (float)comp);
        iVar12 = (int)((float)y * (float)local_918);
        printf("%f %f %f %f %f %f %d %d %d\n",
               (double)(coordy * (v[1][1] - ni[1]) + coordx * (v[0][1] - ni[1]) + ni[1]),
               (double)(coordy * (v[1][2] - ni[2]) + coordx * (v[0][2] - ni[2]) + ni[2]),
               (double)(coordy * (v[2][0] - v[0][0]) + coordx * (v[1][0] - v[0][0]) + v[0][0]),
               (double)(coordy * (n[1][1] - area) + coordx * (n[0][1] - area) + area),
               (double)(coordy * (n[1][2] - (float)k) + coordx * (n[0][2] - (float)k) + (float)k),
               (double)(coordy * (n[2][0] - n[0][0]) + coordx * (n[1][0] - n[0][0]) + n[0][0]),
               (ulong)_h[i._4_4_ * (iVar12 * comp + iVar11)],
               (ulong)_h[(long)(i._4_4_ * (iVar12 * comp + iVar11)) + 1],
               (ulong)_h[(long)(i._4_4_ * (iVar12 * comp + iVar11)) + 2]);
      }
      idx0._4_8_ = idx0._4_8_ + 1;
    }
    stbi_image_free(_h);
    argv_local._4_4_ = 0;
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::string::~string((string *)local_190);
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
    std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector
              ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
               ((long)&warn.field_2 + 8));
    std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector
              ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
               &materials.
                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    tinyobj::attrib_t::~attrib_t
              ((attrib_t *)
               &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char ** argv){

    int point_per_sqm = 10000;

    if (argc < 2) {
      printf("./pc_sampler mesh.obj <optional: points per square meter> > pc.xyz");
      return 1;
    }
    if (argc >= 3) {
      point_per_sqm = std::stoi(argv[2]);
    }

    printf("# pc sampler\n");
    std::default_random_engine generator;
    std::uniform_real_distribution<double> distribution(0.0,1.0);

    tinyobj::attrib_t attrib;
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;

    std::string warn;
    std::string err;

    std::string filename(argv[1]);
    std::string base_dir = GetBaseDir(filename);
    if (base_dir.empty()) {
        base_dir = ".";
    }

    base_dir += "/";


    bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &warn, &err, filename.c_str(),
                              base_dir.c_str());

    printf("# of vertices  = %d\n", (int)(attrib.vertices.size()) / 3);
    printf("# of normals   = %d\n", (int)(attrib.normals.size()) / 3);
    printf("# of texcoords = %d\n", (int)(attrib.texcoords.size()) / 2);
    printf("# of materials = %d\n", (int)materials.size());
    printf("# of shapes    = %d\n", (int)shapes.size());

    materials.push_back(tinyobj::material_t());
    unsigned char* image;
     int w, h;
      int comp;

    for (size_t i = 0; i < materials.size(); i++) {
        printf("# material[%d].diffuse_texname = %s\n", int(i),
        materials[i].diffuse_texname.c_str());
    }

    {
    for (size_t m = 0; m < materials.size(); m++) {
      tinyobj::material_t* mp = &materials[m];

      if (mp->diffuse_texname.length() > 0) {
        // Only load the texture if it is not already loaded
        {
         

          std::string texture_filename = mp->diffuse_texname;
          if (!FileExists(texture_filename)) {
            // Append base dir.
            texture_filename = base_dir + mp->diffuse_texname;
            if (!FileExists(texture_filename)) {
              std::cerr << "# Unable to find file: " << mp->diffuse_texname
                        << std::endl;
              exit(1);
            }
          }

          image = stbi_load(texture_filename.c_str(), &w, &h, &comp, STBI_default);
          if (!image) {
            std::cerr << "# Unable to load texture: " << texture_filename
                      << std::endl;
            exit(1);
          }
          std::cout << "# Loaded texture: " << texture_filename << ", w = " << w
                    << ", h = " << h << ", comp = " << comp << std::endl;
        }
      }
    }
  }

    int s = 0; //take first shape

    for (size_t f = 0; f < shapes[s].mesh.indices.size() / 3; f++) {

        tinyobj::index_t idx0 = shapes[s].mesh.indices[3 * f + 0];
        tinyobj::index_t idx1 = shapes[s].mesh.indices[3 * f + 1];
        tinyobj::index_t idx2 = shapes[s].mesh.indices[3 * f + 2];

        int current_material_id = shapes[s].mesh.material_ids[f];

        if ((current_material_id < 0) ||
            (current_material_id >= static_cast<int>(materials.size()))) {
          // Invaid material ID. Use default material.
          current_material_id =
              materials.size() -
              1;  // Default material is added to the last item in `materials`.
        }
        
       float tc[3][2];
        if (attrib.texcoords.size() > 0) {
          if ((idx0.texcoord_index < 0) || (idx1.texcoord_index < 0) ||
              (idx2.texcoord_index < 0)) {
            // face does not contain valid uv index.
            tc[0][0] = 0.0f;
            tc[0][1] = 0.0f;
            tc[1][0] = 0.0f;
            tc[1][1] = 0.0f;
            tc[2][0] = 0.0f;
            tc[2][1] = 0.0f;
          } else {
            assert(attrib.texcoords.size() >
                   size_t(2 * idx0.texcoord_index + 1));
            assert(attrib.texcoords.size() >
                   size_t(2 * idx1.texcoord_index + 1));
            assert(attrib.texcoords.size() >
                   size_t(2 * idx2.texcoord_index + 1));

            // Flip Y coord.
            tc[0][0] = attrib.texcoords[2 * idx0.texcoord_index];
            tc[0][1] = 1.0f - attrib.texcoords[2 * idx0.texcoord_index + 1];
            tc[1][0] = attrib.texcoords[2 * idx1.texcoord_index];
            tc[1][1] = 1.0f - attrib.texcoords[2 * idx1.texcoord_index + 1];
            tc[2][0] = attrib.texcoords[2 * idx2.texcoord_index];
            tc[2][1] = 1.0f - attrib.texcoords[2 * idx2.texcoord_index + 1];
          }
        } else {
          tc[0][0] = 0.0f;
          tc[0][1] = 0.0f;
          tc[1][0] = 0.0f;
          tc[1][1] = 0.0f;
          tc[2][0] = 0.0f;
          tc[2][1] = 0.0f;
        }

        //printf("%f %f %f %f %f %f\n", tc[0][0], tc[0][1], tc[1][0], tc[1][1], tc[2][0], tc[2][1]);
        
        int vi[3];      // indexes
        float v[3][3];  // coordinates
        float ni[3];
        float n[3][3];


         for (int k = 0; k < 3; k++) {
          vi[0] = idx0.vertex_index;
          vi[1] = idx1.vertex_index;
          vi[2] = idx2.vertex_index;
          
          ni[0] = idx0.normal_index;
          ni[1] = idx1.normal_index;
          ni[2] = idx2.normal_index;

          assert(vi[0] >= 0);
          assert(vi[1] >= 0);
          assert(vi[2] >= 0);

          v[0][k] = attrib.vertices[3 * vi[0] + k];
          v[1][k] = attrib.vertices[3 * vi[1] + k];
          v[2][k] = attrib.vertices[3 * vi[2] + k];
        
          n[0][k] = attrib.normals[3 * ni[0] + k];
          n[1][k] = attrib.normals[3 * ni[1] + k];
          n[2][k] = attrib.normals[3 * ni[2] + k];
        

        }

        float area;

        float l0 = sqrt((v[0][0] - v[1][0]) * (v[0][0] - v[1][0]) + (v[0][1] - v[1][1]) * (v[0][1] - v[1][1]) + (v[0][2] - v[1][2]) * (v[0][2] - v[1][2]));
        float l1 = sqrt((v[2][0] - v[1][0]) * (v[2][0] - v[1][0]) + (v[2][1] - v[1][1]) * (v[2][1] - v[1][1]) + (v[2][2] - v[1][2]) * (v[2][2] - v[1][2]));
        float l2 = sqrt((v[0][0] - v[2][0]) * (v[0][0] - v[2][0]) + (v[0][1] - v[2][1]) * (v[0][1] - v[2][1]) + (v[0][2] - v[2][2]) * (v[0][2] - v[2][2]));
        
        float s = (l0 + l1 + l2)/2;

        area = sqrt(s * (s-l0) * (s-l1) * (s-l2));
        
        int nsamples = int(area * point_per_sqm);
        printf("# area %f nsamples %d \n", area, nsamples);
        

        for (int j = 0; j < nsamples; j++) {
            float lambda_a = 1;
            float lambda_b = 1;

            while (lambda_a + lambda_b > 1) {
              lambda_a = distribution(generator);
              lambda_b = distribution(generator);
            }

            float coordx = tc[0][0] + lambda_a * (tc[1][0] - tc[0][0]) + lambda_b*(tc[2][0] - tc[0][0]);
            float coordy = tc[0][1] + lambda_a * (tc[1][1] - tc[0][1]) + lambda_b*(tc[2][1] - tc[0][1]);

            if (coordx < 0) coordx = 0;
            if (coordx > 1) coordx = 1;
            if (coordy < 0) coordy = 0;
            if (coordy > 1) coordy = 1;

            int x = int(coordx * w);
            int y = int(coordy * h);

            unsigned char r = image[comp*(y * w + x)];
            unsigned char g = image[comp*(y * w + x) + 1];
            unsigned char b = image[comp*(y * w + x) + 2];

            float px = v[0][0] + lambda_a*(v[1][0] - v[0][0]) + lambda_b*(v[2][0] - v[0][0]);
            float py = v[0][1] + lambda_a*(v[1][1] - v[0][1]) + lambda_b*(v[2][1] - v[0][1]);
            float pz = v[0][2] + lambda_a*(v[1][2] - v[0][2]) + lambda_b*(v[2][2] - v[0][2]);

            float nx = n[0][0] + lambda_a*(n[1][0] - n[0][0]) + lambda_b*(n[2][0] - n[0][0]);
            float ny = n[0][1] + lambda_a*(n[1][1] - n[0][1]) + lambda_b*(n[2][1] - n[0][1]);
            float nz = n[0][2] + lambda_a*(n[1][2] - n[0][2]) + lambda_b*(n[2][2] - n[0][2]);

            printf("%f %f %f %f %f %f %d %d %d\n", px, py, pz, nx, ny, nz, int(r), int(g), int(b));
        }

    }


    stbi_image_free(image);

    return 0;
}